

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_s.cpp
# Opt level: O2

void sscal(int n,float sa,float *x,int incx)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  float *pfVar4;
  bool bVar5;
  
  if (0 < n) {
    if (incx == 1) {
      for (uVar3 = 0; (ulong)(uint)n % 5 != uVar3; uVar3 = uVar3 + 1) {
        x[uVar3] = x[uVar3] * sa;
      }
      auVar1._8_8_ = 0;
      auVar1._0_8_ = CONCAT44(0,n);
      pfVar4 = x + SUB168(auVar1 / ZEXT816(5),0) * -5 + CONCAT44(0,n) + 4;
      for (iVar2 = n + SUB164(auVar1 / ZEXT816(5),0) * -5; iVar2 < n; iVar2 = iVar2 + 5) {
        pfVar4[-4] = pfVar4[-4] * sa;
        pfVar4[-3] = pfVar4[-3] * sa;
        pfVar4[-2] = pfVar4[-2] * sa;
        pfVar4[-1] = pfVar4[-1] * sa;
        *pfVar4 = *pfVar4 * sa;
        pfVar4 = pfVar4 + 5;
      }
    }
    else {
      pfVar4 = x + (incx >> 0x1f & (1 - n) * incx);
      while (bVar5 = n != 0, n = n + -1, bVar5) {
        *pfVar4 = *pfVar4 * sa;
        pfVar4 = pfVar4 + incx;
      }
    }
  }
  return;
}

Assistant:

void sscal ( int n, float sa, float x[], int incx )

//****************************************************************************80
//
//  Purpose:
//
//    SSCAL scales a float vector by a constant.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    23 February 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, float SA, the multiplier.
//
//    Input/output, float X[*], the vector to be scaled.
//
//    Input, int INCX, the increment between successive entries of X.
//
{
  int i;
  int ix;
  int m;

  if ( n <= 0 )
  {
  }
  else if ( incx == 1 )
  {
    m = n % 5;

    for ( i = 0; i < m; i++ )
    {
      x[i] = sa * x[i];
    }

    for ( i = m; i < n; i = i + 5 )
    {
      x[i]   = sa * x[i];
      x[i+1] = sa * x[i+1];
      x[i+2] = sa * x[i+2];
      x[i+3] = sa * x[i+3];
      x[i+4] = sa * x[i+4];
    }
  }
  else
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( - n + 1 ) * incx;
    }

    for ( i = 0; i < n; i++ )
    {
      x[ix] = sa * x[ix];
      ix = ix + incx;
    }

  }

  return;
}